

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLURL::XMLURL(XMLURL *this,XMLURL *baseURL,char *relativeURL)

{
  MemoryManager *manager;
  XMLCh *toDelete;
  CleanupType_conflict6 cleanup;
  ArrayJanitor<char16_t> janRel;
  JanitorMemFunCall<xercesc_4_0::XMLURL> local_40;
  ArrayJanitor<char16_t> local_28;
  
  this->_vptr_XMLURL = (_func_int **)&PTR__XMLURL_003fb4d0;
  manager = baseURL->fMemoryManager;
  this->fMemoryManager = manager;
  this->fFragment = (XMLCh *)0x0;
  this->fHost = (XMLCh *)0x0;
  this->fPassword = (XMLCh *)0x0;
  this->fPath = (XMLCh *)0x0;
  this->fPortNum = 0;
  this->fProtocol = Unknown;
  this->fQuery = (XMLCh *)0x0;
  this->fUser = (XMLCh *)0x0;
  *(undefined8 *)((long)&this->fUser + 1) = 0;
  *(undefined8 *)((long)&this->fURLText + 1) = 0;
  local_40.fToCall = (MFPT)cleanUp;
  local_40._16_8_ = 0;
  local_40.fObject = this;
  toDelete = XMLString::transcode(relativeURL,manager);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_28,toDelete,this->fMemoryManager);
  setURL(this,baseURL,toDelete);
  local_40.fObject = (XMLURL *)0x0;
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_28);
  JanitorMemFunCall<xercesc_4_0::XMLURL>::~JanitorMemFunCall(&local_40);
  return;
}

Assistant:

XMLURL::XMLURL(const  XMLURL&        baseURL
             , const char* const     relativeURL) :

    fMemoryManager(baseURL.fMemoryManager)
    , fFragment(0)
    , fHost(0)
    , fPassword(0)
    , fPath(0)
    , fPortNum(0)
    , fProtocol(XMLURL::Unknown)
    , fQuery(0)
    , fUser(0)
    , fURLText(0)
    , fHasInvalidChar(false)
{
    CleanupType cleanup(this, &XMLURL::cleanUp);

    XMLCh* tmpRel = XMLString::transcode(relativeURL, fMemoryManager);
    ArrayJanitor<XMLCh> janRel(tmpRel, fMemoryManager);
	try
	{
		setURL(baseURL, tmpRel);
	}
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}